

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

int64_t celero::GetRAMPhysicalTotal(void)

{
  undefined1 local_78 [8];
  sysinfo memInfo;
  
  sysinfo((sysinfo *)local_78);
  return memInfo.loads[2] * (uint)memInfo.freehigh;
}

Assistant:

int64_t celero::GetRAMPhysicalTotal()
{
#ifdef _WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return static_cast<int64_t>(memInfo.ullTotalPhys);
#elif defined(__APPLE__)
	return -1;
#else
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	return memInfo.totalram * memInfo.mem_unit;
#endif
}